

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O2

_Bool effect_handler_BREATH(effect_handler_context_t *context)

{
  wchar_t type;
  wchar_t wVar1;
  anon_enum_32 aVar2;
  long lVar3;
  _Bool _Var4;
  wchar_t wVar5;
  uint32_t uVar6;
  wchar_t wVar7;
  monster *mon;
  monster *pmVar8;
  wchar_t rad;
  ulong uVar9;
  wchar_t flg;
  ulong uVar10;
  bool bVar11;
  source origin;
  loc target;
  
  wVar5 = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  type = context->subtype;
  target = (loc)loc(-1,-1);
  rad = context->radius;
  wVar1 = context->other;
  uVar10 = 0x14;
  if (L'\x14' < wVar1) {
    uVar10 = (ulong)(uint)wVar1;
  }
  if (rad == L'\0') {
    rad = (wchar_t)z_info->max_range;
  }
  aVar2 = (context->origin).what;
  uVar9 = 4;
  flg = L'Ѱ';
  if (aVar2 == SRC_PLAYER) {
    msgt(projections[type].msgt,"You breathe %s.",projections[type].desc);
    wVar7 = context->dir;
    if (wVar7 == L'\x05') {
      _Var4 = target_okay();
      if (_Var4) {
        target_get((loc_conflict *)&target);
        goto LAB_001387ec;
      }
      wVar7 = context->dir;
    }
    target = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[wVar7]);
  }
  else {
    flg = L'Ѱ';
    if (aVar2 == SRC_MONSTER) {
      mon = cave_monster(cave,(context->origin).which.monster);
      pmVar8 = monster_target_monster((effect_handler_context_t_conflict *)context);
      wVar5 = monster_effect_level(mon,L'\x02');
      lVar3 = 100;
      while( true ) {
        bVar11 = wVar5 == L'\0';
        wVar5 = wVar5 + L'\xffffffff';
        if (bVar11) break;
        lVar3 = (long)((int)lVar3 * 0x3c) / 100;
      }
      uVar6 = Rand_div(100);
      if ((int)uVar6 < (int)lVar3) {
        if (pmVar8 == (monster *)0x0) {
          _Var4 = monster_is_decoyed(mon);
          if (_Var4) {
            target = cave_find_decoy(cave);
          }
          else {
            target.x = (player->grid).x;
            target.y = (player->grid).y;
          }
        }
        else {
          target.x = (pmVar8->grid).x;
          target.y = (pmVar8->grid).y;
        }
      }
      else {
        uVar6 = Rand_div(9);
        target = (loc)loc_sum(mon->grid,(loc_conflict)ddgrid[(long)(int)uVar6 + 1]);
      }
      wVar5 = breath_dam(type,(int)mon->hp);
      _Var4 = monster_is_powerful(mon);
      uVar9 = (ulong)((uint)_Var4 * 2 + 4);
      flg = L'౰';
    }
  }
LAB_001387ec:
  if (wVar1 < L'<') {
    uVar9 = (uint)((int)uVar9 * 0x3c) / uVar10;
  }
  origin._4_4_ = 0;
  origin.what = (context->origin).what;
  origin.which.trap = (context->origin).which.trap;
  _Var4 = project(origin,rad,target,wVar5,type,flg,(wchar_t)uVar10,(uint8_t)uVar9,context->obj);
  if (_Var4) {
    context->ident = true;
  }
  return true;
}

Assistant:

bool effect_handler_BREATH(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, false);
	int type = context->subtype;

	struct loc target = loc(-1, -1);

	/* Diameter of source starts at 4, so full strength up to 3 grids from
	 * the breather. */
	int diameter_of_source = 4;

	/* Minimum breath width is 20 degrees */
	int degrees_of_arc = MAX(context->other, 20);

	int flg = PROJECT_ARC | PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL;

	/* Distance breathed generally has no fixed limit. */
	int rad = context->radius ? context->radius : z_info->max_range;

	/* Player or monster? */
	if (context->origin.what == SRC_MONSTER) {
		struct monster *mon = cave_monster(cave, context->origin.which.monster);
		struct monster *t_mon = monster_target_monster(context);
		int conf_level, accuracy = 100;

		flg |= PROJECT_PLAY;

		conf_level = monster_effect_level(mon, MON_TMD_CONF);
		while (conf_level) {
			accuracy *= (100 - CONF_RANDOM_CHANCE);
			accuracy /= 100;
			conf_level--;
		}

		if (randint1(100) > accuracy) {
			/* Confused direction. */
			int dir = randint1(9);

			target = loc_sum(mon->grid, ddgrid[dir]);
		} else if (t_mon) {
			/* Target monster. */
			target = t_mon->grid;
		} else {
			/* Target player. */
			if (monster_is_decoyed(mon)) {
				target = cave_find_decoy(cave);
			} else {
				target = player->grid;
			}
		}

		dam = breath_dam(type, mon->hp);

		/* Powerful monster */
		if (monster_is_powerful(mon)) {
			/* Breath is now full strength at 5 grids */
			diameter_of_source *= 3;
			diameter_of_source /= 2;
		}
	} else if (context->origin.what == SRC_PLAYER) {
		msgt(projections[type].msgt, "You breathe %s.", projections[type].desc);

		/* Ask for a target if no direction given */
		if (context->dir == DIR_TARGET && target_okay()) {
			target_get(&target);
		} else {
			target = loc_sum(player->grid, ddgrid[context->dir]);
		}
	}

	/* Adjust the diameter of the energy source */
	if (degrees_of_arc < 60) {
		/* Narrower cone means energy drops off less quickly. We now have:
		 * - 30 degree regular breath  | full strength at 7 grids
		 * - 30 degree powerful breath | full strength at 11 grids
		 * - 20 degree regular breath  | full strength at 11 grids
		 * - 20 degree powerful breath | full strength at 17 grids
		 * where grids are measured from the breather. */
		diameter_of_source = diameter_of_source * 60 / degrees_of_arc;

		/* Max */
		if (diameter_of_source > 25)
			diameter_of_source = 25;
	}

	/* Breathe at the target */
	if (project(context->origin, rad, target, dam, type, flg, degrees_of_arc,
				diameter_of_source, context->obj))
		context->ident = true;

	return true;
}